

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::WriteObjectBuildStatement
          (cmNinjaTargetGenerator *this,cmSourceFile *source,string *config,string *fileConfig,
          bool firstForConfig)

{
  __node_base_ptr *pp_Var1;
  pointer *ppbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar3;
  cmGlobalNinjaGenerator *pcVar4;
  string *psVar5;
  cmMakefile *pcVar6;
  mapped_type *pmVar7;
  mapped_type *defines;
  mapped_type *includes;
  mapped_type *pmVar8;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  cmCustomCommand *pcVar9;
  mapped_type *this_01;
  cmGeneratorTarget *pcVar10;
  cmGeneratedFileStream *pcVar11;
  ulong uVar12;
  cmLocalNinjaGenerator *pcVar13;
  size_type sVar14;
  reference pbVar15;
  iterator iVar16;
  iterator iVar17;
  iterator __result_00;
  MapToNinjaPathImpl __unary_op;
  cmGeneratorTarget *target;
  bool bVar18;
  string_view sVar19;
  string_view value;
  basic_string_view<char,_std::char_traits<char>_> __y;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar20;
  undefined1 auVar21 [16];
  byte local_1de9;
  bool local_1c96;
  bool local_1c95;
  byte local_1c0a;
  byte local_1b72;
  bool local_1a15;
  byte local_1a14;
  byte local_1a12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_19a8;
  allocator<char> local_1989;
  string local_1988;
  undefined1 local_1968 [8];
  cmNinjaBuild build;
  string local_1828;
  undefined1 local_1808 [8];
  string evaluatedObjectOutputs;
  string local_17e0;
  cmValue local_17c0;
  cmValue objectOutputs;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_17a0;
  const_iterator local_1798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1790;
  cmGlobalNinjaGenerator *local_1788;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1780;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1778;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1770;
  undefined1 local_1768 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headers;
  key_type local_1748;
  string_view local_1728;
  string local_1718;
  string local_16f8;
  undefined1 local_16d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> sideEffect;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ispcSideEfffectObjects;
  string rootObjectDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ispcSuffixes;
  cmAlphaNum local_1630;
  cmAlphaNum local_1600;
  undefined1 local_15d0 [8];
  string ispcHeader;
  cmAlphaNum local_1580;
  string local_1550;
  allocator<char> local_1529;
  string local_1528;
  cmValue local_1508;
  cmValue prop;
  string ispcHeaderDirectory;
  string local_14d8;
  cmValue local_14b8;
  cmValue ispcSuffixProp;
  undefined1 local_1490 [8];
  string ispcSource;
  string *objectName;
  cmAlphaNum local_1438;
  string local_1408;
  allocator<char> local_13e1;
  string local_13e0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_13c0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_13b8;
  iterator pchIt;
  string local_13a8;
  cmValue local_1388;
  allocator<char> local_1379;
  string local_1378;
  allocator<char> local_1351;
  key_type local_1350;
  string_view local_1330;
  string local_1320;
  allocator<char> local_12f9;
  key_type local_12f8;
  string_view local_12d8;
  string local_12c8;
  allocator<char> local_12a1;
  key_type local_12a0;
  cmAlphaNum local_1280;
  cmAlphaNum local_1250;
  undefined1 local_1220 [8];
  string ddModmapFile;
  key_type local_11f8;
  undefined1 local_11d8 [8];
  string dyndep;
  string local_11b0;
  cmAlphaNum local_1190;
  cmAlphaNum local_1160;
  undefined1 local_1130 [8];
  string ddiFile;
  key_type local_1108;
  allocator<char> local_10e1;
  key_type local_10e0;
  cmAlphaNum local_10c0;
  cmAlphaNum local_1090;
  string local_1060;
  undefined1 local_1040 [8];
  string sourceDirectoryFlag;
  undefined1 local_1000 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourceDirectory;
  key_type local_fe0;
  cmAlphaNum local_fc0;
  cmAlphaNum local_f90;
  string local_f60;
  string *local_f40;
  string *postFlag;
  cmNinjaBuild ppBuild;
  cmAlphaNum local_de8;
  string local_db8;
  string local_d98;
  string local_d78;
  string local_d58;
  undefined1 local_d38 [8];
  string ppFileName;
  string scanRuleName;
  bool compilePPWithDefines;
  bool compilePP;
  allocator<char> local_cd9;
  string local_cd8;
  string *local_cb8;
  string *tgtpp;
  char *local_ca8;
  FortranPreprocess local_ca0;
  allocator<char> local_c99;
  FortranPreprocess preprocess;
  string local_c78 [8];
  string srcpp;
  cmAlphaNum local_c28;
  undefined1 local_bf8 [8];
  string modmapFormatVar;
  string modmapFormat;
  undefined1 local_bb0 [3];
  bool compilationPreprocesses;
  bool needDyndep;
  string local_b90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b70;
  cmGlobalNinjaGenerator *local_b68;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b60;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b58;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b50;
  string local_b48;
  string *local_b28;
  string *odi;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  undefined1 local_ad8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objDepList;
  string local_ab8;
  cmValue local_a98;
  cmValue objectDeps;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a70;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a68;
  string local_a60;
  reference local_a40;
  string *arch_1;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_a18;
  cmValue local_9f8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_9f0;
  undefined1 local_9e8;
  undefined1 local_9e0 [8];
  string pchSource;
  string *arch;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pchSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depList;
  allocator<char> local_919;
  string local_918;
  cmValue local_8f8;
  cmValue pchExtension;
  key_type local_8e8;
  allocator<char> local_8c1;
  key_type local_8c0;
  allocator<char> local_899;
  key_type local_898;
  allocator<char> local_871;
  key_type local_870;
  cmAlphaNum local_850;
  cmAlphaNum local_820;
  string local_7f0;
  string_view local_7d0;
  string local_7c0;
  cmAlphaNum local_7a0;
  string local_770;
  cmAlphaNum local_750;
  undefined1 local_720 [8];
  string dependFileName;
  key_type local_6f8;
  cmAlphaNum local_6d8;
  cmAlphaNum local_6a8;
  string local_678;
  string_view local_658;
  string local_648;
  cmAlphaNum local_628;
  cmAlphaNum local_5f8;
  undefined1 local_5c8 [8];
  string repVar;
  bool replaceExt;
  cmAlphaNum local_580;
  cmAlphaNum local_550;
  string local_520;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_500;
  allocator<char> local_4e9;
  key_type local_4e8;
  string local_4c8;
  allocator<char> local_4a1;
  key_type local_4a0;
  string local_480;
  allocator<char> local_459;
  key_type local_458;
  string local_438;
  pointer *local_418;
  cmNinjaVars *vars;
  undefined1 local_3f0 [8];
  cmNinjaBuild objBuild;
  int commandLineLengthLimit;
  bool lang_supports_response;
  cmValue flag;
  cmAlphaNum local_290;
  undefined1 local_260 [8];
  string cmakeLinkVar;
  cmAlphaNum local_210;
  undefined1 local_1e0 [8];
  string cmakeVarLang;
  string objectFileDir;
  undefined1 local_180 [8];
  string objectFileName;
  cmAlphaNum local_140;
  string local_110;
  cmAlphaNum local_f0;
  string local_c0;
  undefined1 local_a0 [8];
  string objectDir;
  undefined1 local_70 [8];
  string sourceFilePath;
  string language;
  bool firstForConfig_local;
  string *fileConfig_local;
  string *config_local;
  cmSourceFile *source_local;
  cmNinjaTargetGenerator *this_local;
  
  cmSourceFile::GetLanguage_abi_cxx11_((string *)((long)&sourceFilePath.field_2 + 8),source);
  GetCompiledSourceNinjaPath_abi_cxx11_((string *)local_70,this,source);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&local_110,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  cmAlphaNum::cmAlphaNum(&local_f0,&local_110);
  pcVar4 = GetGlobalGenerator(this);
  (*(pcVar4->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49])
            ((undefined1 *)((long)&objectFileName.field_2 + 8),pcVar4,config);
  cmAlphaNum::cmAlphaNum(&local_140,(string *)((long)&objectFileName.field_2 + 8));
  cmStrCat<>(&local_c0,&local_f0,&local_140);
  psVar5 = ConvertToNinjaPath(this,&local_c0);
  std::__cxx11::string::string((string *)local_a0,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)(objectFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_110);
  GetObjectFilePath((string *)((long)&objectFileDir.field_2 + 8),this,source,config);
  psVar5 = ConvertToNinjaPath(this,(string *)((long)&objectFileDir.field_2 + 8));
  std::__cxx11::string::string((string *)local_180,(string *)psVar5);
  std::__cxx11::string::~string((string *)(objectFileDir.field_2._M_local_buf + 8));
  cmsys::SystemTools::GetFilenamePath
            ((string *)((long)&cmakeVarLang.field_2 + 8),(string *)local_180);
  cmAlphaNum::cmAlphaNum(&local_210,"CMAKE_");
  cmAlphaNum::cmAlphaNum
            ((cmAlphaNum *)((long)&cmakeLinkVar.field_2 + 8),
             (string *)((long)&sourceFilePath.field_2 + 8));
  cmStrCat<>((string *)local_1e0,&local_210,(cmAlphaNum *)((long)&cmakeLinkVar.field_2 + 8));
  cmAlphaNum::cmAlphaNum(&local_290,(string *)local_1e0);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&flag,"_RESPONSE_FILE_FLAG");
  cmStrCat<>((string *)local_260,&local_290,(cmAlphaNum *)&flag);
  pcVar6 = GetMakefile(this);
  _commandLineLengthLimit = cmMakefile::GetDefinition(pcVar6,(string *)local_260);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&sourceFilePath.field_2 + 8),"RC");
  local_1a12 = 1;
  if (!bVar3) {
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&sourceFilePath.field_2 + 8),"CUDA");
    local_1a14 = 0;
    if (bVar3) {
      bVar3 = cmValue::operator_cast_to_bool((cmValue *)&commandLineLengthLimit);
      local_1a14 = bVar3 ^ 0xff;
    }
    local_1a12 = local_1a14;
  }
  objBuild.RspFile.field_2._M_local_buf[0xf] = (local_1a12 ^ 0xff) & 1;
  local_1a15 = false;
  if (objBuild.RspFile.field_2._M_local_buf[0xf] != 0) {
    local_1a15 = ForceResponseFile(this);
  }
  objBuild.RspFile.field_2._8_4_ = -(uint)local_1a15;
  LanguageCompilerRule((string *)&vars,this,(string *)((long)&sourceFilePath.field_2 + 8),config);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_3f0,(string *)&vars);
  std::__cxx11::string::~string((string *)&vars);
  local_418 = &objBuild.OrderOnlyDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ComputeFlagsForObject(&local_438,this,source,(string *)((long)&sourceFilePath.field_2 + 8),config)
  ;
  ppbVar2 = local_418;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"FLAGS",&local_459);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)ppbVar2,&local_458);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_438);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  std::__cxx11::string::~string((string *)&local_438);
  ComputeDefines(&local_480,this,source,(string *)((long)&sourceFilePath.field_2 + 8),config);
  ppbVar2 = local_418;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"DEFINES",&local_4a1);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)ppbVar2,&local_4a0);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_480);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::__cxx11::string::~string((string *)&local_480);
  ComputeIncludes(&local_4c8,this,source,(string *)((long)&sourceFilePath.field_2 + 8),config);
  ppbVar2 = local_418;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"INCLUDES",&local_4e9);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)ppbVar2,&local_4e8);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  std::__cxx11::string::~string((string *)&local_4c8);
  pcVar6 = GetMakefile(this);
  cmAlphaNum::cmAlphaNum(&local_550,"CMAKE_");
  cmAlphaNum::cmAlphaNum(&local_580,(string *)((long)&sourceFilePath.field_2 + 8));
  cmStrCat<char[16]>(&local_520,&local_550,&local_580,(char (*) [16])0xdd1c6a);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar6,&local_520);
  local_500 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
  __y = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("msvc",4);
  bVar3 = std::operator!=(local_500,__y);
  std::__cxx11::string::~string((string *)&local_520);
  if (bVar3) {
    repVar.field_2._M_local_buf[0xf] = '\0';
    uVar12 = std::__cxx11::string::empty();
    if ((uVar12 & 1) == 0) {
      cmAlphaNum::cmAlphaNum(&local_5f8,"CMAKE_");
      cmAlphaNum::cmAlphaNum(&local_628,(string *)((long)&sourceFilePath.field_2 + 8));
      cmStrCat<char[27]>((string *)local_5c8,&local_5f8,&local_628,
                         (char (*) [27])"_DEPFILE_EXTENSION_REPLACE");
      repVar.field_2._M_local_buf[0xf] =
           cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,(string *)local_5c8);
      std::__cxx11::string::~string((string *)local_5c8);
    }
    if ((repVar.field_2._M_local_buf[0xf] & 1U) == 0) {
      pcVar13 = GetLocalGenerator(this);
      cmAlphaNum::cmAlphaNum(&local_6a8,(string *)local_180);
      cmAlphaNum::cmAlphaNum(&local_6d8,".d");
      cmStrCat<>(&local_678,&local_6a8,&local_6d8);
      local_658 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_678);
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_648,
                 &(pcVar13->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,local_658,SHELL);
      ppbVar2 = local_418;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6f8,"DEP_FILE",
                 (allocator<char> *)(dependFileName.field_2._M_local_buf + 0xf));
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)ppbVar2,&local_6f8);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_648);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::allocator<char>::~allocator
                ((allocator<char> *)(dependFileName.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_648);
      std::__cxx11::string::~string((string *)&local_678);
    }
    else {
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_770,(string *)local_180);
      cmAlphaNum::cmAlphaNum(&local_750,&local_770);
      cmAlphaNum::cmAlphaNum(&local_7a0,".d");
      cmStrCat<>((string *)local_720,&local_750,&local_7a0);
      std::__cxx11::string::~string((string *)&local_770);
      pcVar13 = GetLocalGenerator(this);
      cmAlphaNum::cmAlphaNum(&local_820,(string *)((long)&cmakeVarLang.field_2 + 8));
      cmAlphaNum::cmAlphaNum(&local_850,'/');
      cmStrCat<std::__cxx11::string>
                (&local_7f0,&local_820,&local_850,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720);
      local_7d0 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_7f0);
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_7c0,
                 &(pcVar13->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,local_7d0,SHELL);
      ppbVar2 = local_418;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_870,"DEP_FILE",&local_871)
      ;
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)ppbVar2,&local_870);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_7c0);
      std::__cxx11::string::~string((string *)&local_870);
      std::allocator<char>::~allocator(&local_871);
      std::__cxx11::string::~string((string *)&local_7c0);
      std::__cxx11::string::~string((string *)&local_7f0);
      std::__cxx11::string::~string((string *)local_720);
    }
  }
  ppbVar2 = local_418;
  if (firstForConfig) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_898,"FLAGS",&local_899);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)ppbVar2,&local_898);
    ppbVar2 = local_418;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"DEFINES",&local_8c1);
    defines = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)ppbVar2,&local_8c0);
    ppbVar2 = local_418;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8e8,"INCLUDES",(allocator<char> *)((long)&pchExtension.Value + 7));
    includes = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)ppbVar2,&local_8e8);
    ExportObjectCompileCommand
              (this,(string *)((long)&sourceFilePath.field_2 + 8),(string *)local_70,
               (string *)local_a0,(string *)local_180,(string *)((long)&cmakeVarLang.field_2 + 8),
               pmVar7,defines,includes,config);
    std::__cxx11::string::~string((string *)&local_8e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&pchExtension.Value + 7));
    std::__cxx11::string::~string((string *)&local_8c0);
    std::allocator<char>::~allocator(&local_8c1);
    std::__cxx11::string::~string((string *)&local_898);
    std::allocator<char>::~allocator(&local_899);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&objBuild.Rule.field_2 + 8),(value_type *)local_180);
  if (firstForConfig) {
    pcVar6 = GetMakefile(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_918,"CMAKE_PCH_EXTENSION",&local_919);
    local_8f8 = cmMakefile::GetDefinition(pcVar6,&local_918);
    std::__cxx11::string::~string((string *)&local_918);
    std::allocator<char>::~allocator(&local_919);
    sVar19 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_180);
    bVar3 = cmHasSuffix(sVar19,local_8f8);
    if (!bVar3) {
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
               ::operator[](&this->Configs,config);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pmVar8->Objects,(value_type *)local_180);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&objBuild.WorkDirOuts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&architectures.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pp_Var1 = &pchSources._M_h._M_single_bucket;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)pp_Var1);
  cmGeneratorTarget::GetAppleArchs
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,config,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)pp_Var1);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pchSources._M_h._M_single_bucket);
  if (bVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&pchSources._M_h._M_single_bucket);
  }
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1);
  pp_Var1 = &pchSources._M_h._M_single_bucket;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)pp_Var1);
  arch = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)pp_Var1);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arch);
    if (!bVar3) break;
    pchSource.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    cmGeneratorTarget::GetPchSource
              ((string *)local_9e0,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
               (string *)((long)&sourceFilePath.field_2 + 8),(string *)pchSource.field_2._8_8_);
    uVar12 = std::__cxx11::string::empty();
    if ((uVar12 & 1) == 0) {
      pVar20 = std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range1,(value_type *)local_9e0);
      local_9f0._M_cur =
           (__node_type *)
           pVar20.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_9e8 = pVar20.second;
    }
    std::__cxx11::string::~string((string *)local_9e0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  bVar3 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1);
  __range2._6_1_ = 0;
  __range2._5_1_ = 0;
  local_1b72 = 0;
  if (!bVar3) {
    std::allocator<char>::allocator();
    __range2._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a18,"SKIP_PRECOMPILE_HEADERS",
               (allocator<char> *)((long)&__range2 + 7));
    __range2._5_1_ = 1;
    local_9f8 = cmSourceFile::GetProperty(source,&local_a18);
    bVar3 = cmValue::operator_cast_to_bool(&local_9f8);
    local_1b72 = bVar3 ^ 0xff;
  }
  if ((__range2._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a18);
  }
  if ((__range2._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  }
  if ((local_1b72 & 1) != 0) {
    pp_Var1 = &pchSources._M_h._M_single_bucket;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)pp_Var1);
    arch_1 = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)pp_Var1);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&arch_1);
      if (!bVar3) break;
      local_a40 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      cmGeneratorTarget::GetPchHeader
                (&local_a60,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
                 (string *)((long)&sourceFilePath.field_2 + 8),local_a40);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&architectures.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_a60);
      std::__cxx11::string::~string((string *)&local_a60);
      psVar5 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      local_a68._M_cur =
           (__node_type *)
           std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1,psVar5);
      local_a70._M_cur =
           (__node_type *)
           std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1);
      bVar3 = std::__detail::operator==(&local_a68,&local_a70);
      if (bVar3) {
        cmGeneratorTarget::GetPchFile
                  ((string *)&objectDeps,(this->super_cmCommonTargetGenerator).GeneratorTarget,
                   config,(string *)((long)&sourceFilePath.field_2 + 8),local_a40);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&architectures.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&objectDeps
                   );
        std::__cxx11::string::~string((string *)&objectDeps);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ab8,"OBJECT_DEPENDS",
             (allocator<char> *)
             ((long)&objDepList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_a98 = cmSourceFile::GetProperty(source,&local_ab8);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&objDepList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar3 = cmValue::operator_cast_to_bool(&local_a98);
  if (bVar3) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_a98);
    sVar19 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5)
    ;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_ad8,sVar19,false);
    iVar16 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_ad8);
    iVar17 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_ad8);
    __result = std::
               back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&architectures.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    copy<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )iVar16._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )iVar17._M_current,__result);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_ad8);
  }
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&architectures.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar3) {
    ppbVar2 = &architectures.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)ppbVar2);
    odi = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)ppbVar2);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&odi);
      if (!bVar3) break;
      local_b28 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_1);
      bVar3 = cmsys::SystemTools::FileIsFullPath(local_b28);
      if (bVar3) {
        cmsys::SystemTools::CollapseFullPath(&local_b48,local_b28);
        std::__cxx11::string::operator=((string *)local_b28,(string *)&local_b48);
        std::__cxx11::string::~string((string *)&local_b48);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    ppbVar2 = &architectures.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_b50._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ppbVar2);
    local_b58._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar2);
    local_b60 = std::
                back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&objBuild.ExplicitDeps.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_b68 = (cmGlobalNinjaGenerator *)MapToNinjaPath(this);
    local_b70 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)std::
                   transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                             (local_b50,local_b58,local_b60,(MapToNinjaPathImpl)local_b68);
  }
  OrderDependsTargetForTarget(&local_b90,this,config);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&objBuild.ImplicitDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_b90);
  std::__cxx11::string::~string((string *)&local_b90);
  modmapFormat.field_2._M_local_buf[0xe] = '\0';
  modmapFormat.field_2._M_local_buf[0xd] = '\0';
  bVar3 = cmSourceFile::GetIsGenerated(source,GlobalAndLocal);
  local_1c0a = 0;
  if (bVar3) {
    std::allocator<char>::allocator();
    modmapFormat.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_bb0,"__CMAKE_GENERATED_BY_CMAKE",
               (allocator<char> *)(modmapFormat.field_2._M_local_buf + 0xf));
    modmapFormat.field_2._M_local_buf[0xd] = '\x01';
    bVar3 = cmSourceFile::GetPropertyAsBool(source,(string *)local_bb0);
    local_1c0a = 0;
    if (!bVar3) {
      pcVar9 = cmSourceFile::GetCustomCommand(source);
      local_1c0a = 0;
      if (pcVar9 == (cmCustomCommand *)0x0) {
        pcVar4 = GetGlobalGenerator(this);
        bVar3 = cmGlobalNinjaGenerator::HasCustomCommandOutput(pcVar4,(string *)local_70);
        local_1c0a = bVar3 ^ 0xff;
      }
    }
  }
  if ((modmapFormat.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)local_bb0);
  }
  if ((modmapFormat.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(modmapFormat.field_2._M_local_buf + 0xf));
  }
  if ((local_1c0a & 1) != 0) {
    pcVar4 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddAssumedSourceDependencies
              (pcVar4,(string *)local_70,
               (cmNinjaDeps *)
               &objBuild.ImplicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  modmapFormat.field_2._M_local_buf[0xc] =
       NeedDyndep(this,(string *)((long)&sourceFilePath.field_2 + 8),config);
  bVar3 = NeedExplicitPreprocessing(this,(string *)((long)&sourceFilePath.field_2 + 8));
  modmapFormat.field_2._M_local_buf[0xb] = (bVar3 ^ 0xffU) & 1;
  std::__cxx11::string::string((string *)(modmapFormatVar.field_2._M_local_buf + 8));
  if ((modmapFormat.field_2._M_local_buf[0xc] & 1U) != 0) {
    cmAlphaNum::cmAlphaNum(&local_c28,"CMAKE_EXPERIMENTAL_");
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)((long)&srcpp.field_2 + 8),
               (string *)((long)&sourceFilePath.field_2 + 8));
    cmStrCat<char[19]>((string *)local_bf8,&local_c28,(cmAlphaNum *)((long)&srcpp.field_2 + 8),
                       (char (*) [19])"_MODULE_MAP_FORMAT");
    psVar5 = cmMakefile::GetSafeDefinition
                       ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_bf8);
    std::__cxx11::string::operator=
              ((string *)(modmapFormatVar.field_2._M_local_buf + 8),(string *)psVar5);
    std::__cxx11::string::~string((string *)local_bf8);
  }
  if ((modmapFormat.field_2._M_local_buf[0xc] & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&preprocess,"Fortran_PREPROCESS",&local_c99);
    psVar5 = cmSourceFile::GetSafeProperty(source,(string *)&preprocess);
    std::__cxx11::string::string(local_c78,(string *)psVar5);
    std::__cxx11::string::~string((string *)&preprocess);
    std::allocator<char>::~allocator(&local_c99);
    auVar21 = std::__cxx11::string::operator_cast_to_basic_string_view(local_c78);
    sVar19._M_str = auVar21._8_8_;
    tgtpp = auVar21._0_8_;
    sVar19._M_len = (size_t)sVar19._M_str;
    local_ca8 = sVar19._M_str;
    local_ca0 = cmOutputConverter::GetFortranPreprocess((cmOutputConverter *)tgtpp,sVar19);
    if (local_ca0 == Unset) {
      pcVar10 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_cd8,"Fortran_PREPROCESS",&local_cd9);
      psVar5 = cmGeneratorTarget::GetSafeProperty(pcVar10,&local_cd8);
      std::__cxx11::string::~string((string *)&local_cd8);
      std::allocator<char>::~allocator(&local_cd9);
      local_cb8 = psVar5;
      auVar21 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
      value._M_str = auVar21._8_8_;
      value._M_len = (size_t)value._M_str;
      local_ca0 = cmOutputConverter::GetFortranPreprocess(auVar21._0_8_,value);
    }
    bVar3 = (modmapFormat.field_2._M_local_buf[0xb] & 1U) == 0;
    bVar18 = local_ca0 != NotNeeded;
    local_1c95 = bVar3 && bVar18;
    local_1c96 = false;
    if (bVar3 && bVar18) {
      local_1c96 = CompileWithDefines(this,(string *)((long)&sourceFilePath.field_2 + 8));
    }
    std::__cxx11::string::string((string *)(ppFileName.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_d38);
    if (bVar3 && bVar18) {
      LanguagePreprocessAndScanRule
                (&local_d58,this,(string *)((long)&sourceFilePath.field_2 + 8),config);
      std::__cxx11::string::operator=
                ((string *)(ppFileName.field_2._M_local_buf + 8),(string *)&local_d58);
      std::__cxx11::string::~string((string *)&local_d58);
      GetPreprocessedFilePath(&local_d78,this,source,config);
      psVar5 = ConvertToNinjaPath(this,&local_d78);
      std::__cxx11::string::operator=((string *)local_d38,(string *)psVar5);
      std::__cxx11::string::~string((string *)&local_d78);
    }
    else {
      LanguageScanRule(&local_d98,this,(string *)((long)&sourceFilePath.field_2 + 8),config);
      std::__cxx11::string::operator=
                ((string *)(ppFileName.field_2._M_local_buf + 8),(string *)&local_d98);
      std::__cxx11::string::~string((string *)&local_d98);
      cmAlphaNum::cmAlphaNum(&local_de8,(string *)local_180);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&ppBuild.RspFile.field_2 + 8),".ddi.i");
      cmStrCat<>(&local_db8,&local_de8,(cmAlphaNum *)((long)&ppBuild.RspFile.field_2 + 8));
      std::__cxx11::string::operator=((string *)local_d38,(string *)&local_db8);
      std::__cxx11::string::~string((string *)&local_db8);
    }
    anon_unknown.dwarf_910b8c::GetScanBuildStatement
              ((cmNinjaBuild *)&postFlag,(string *)((long)&ppFileName.field_2 + 8),
               (string *)local_d38,local_1c95,local_1c96,(cmNinjaBuild *)local_3f0,
               (cmNinjaVars *)local_418,(string *)((long)&modmapFormatVar.field_2 + 8),
               (string *)local_180,(cmLocalGenerator *)this->LocalGenerator);
    if (bVar3 && bVar18) {
      pcVar6 = (this->super_cmCommonTargetGenerator).Makefile;
      cmAlphaNum::cmAlphaNum(&local_f90,"CMAKE_");
      cmAlphaNum::cmAlphaNum(&local_fc0,(string *)((long)&sourceFilePath.field_2 + 8));
      cmStrCat<char[18]>(&local_f60,&local_f90,&local_fc0,(char (*) [18])"_POSTPROCESS_FLAG");
      psVar5 = cmMakefile::GetSafeDefinition(pcVar6,&local_f60);
      std::__cxx11::string::~string((string *)&local_f60);
      ppbVar2 = local_418;
      pcVar13 = this->LocalGenerator;
      local_f40 = psVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_fe0,"FLAGS",
                 (allocator<char> *)
                 ((long)&sourceDirectory.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)ppbVar2,&local_fe0);
      (*(pcVar13->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
                (pcVar13,pmVar7,local_f40);
      std::__cxx11::string::~string((string *)&local_fe0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&sourceDirectory.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1000);
      psVar5 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      cmsys::SystemTools::GetParentDirectory
                ((string *)((long)&sourceDirectoryFlag.field_2 + 8),psVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1000,(value_type *)((long)&sourceDirectoryFlag.field_2 + 8));
      std::__cxx11::string::~string((string *)(sourceDirectoryFlag.field_2._M_local_buf + 8));
      cmLocalGenerator::GetIncludeFlags
                ((string *)local_1040,(cmLocalGenerator *)this->LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1000,(this->super_cmCommonTargetGenerator).GeneratorTarget,
                 (string *)((long)&sourceFilePath.field_2 + 8),config,false);
      cmAlphaNum::cmAlphaNum(&local_1090,(string *)local_1040);
      cmAlphaNum::cmAlphaNum(&local_10c0,' ');
      ppbVar2 = local_418;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_10e0,"INCLUDES",&local_10e1);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)ppbVar2,&local_10e0);
      cmStrCat<std::__cxx11::string>(&local_1060,&local_1090,&local_10c0,pmVar7);
      ppbVar2 = local_418;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1108,"INCLUDES",
                 (allocator<char> *)(ddiFile.field_2._M_local_buf + 0xf));
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)ppbVar2,&local_1108);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_1060);
      std::__cxx11::string::~string((string *)&local_1108);
      std::allocator<char>::~allocator((allocator<char> *)(ddiFile.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_1060);
      std::__cxx11::string::~string((string *)&local_10e0);
      std::allocator<char>::~allocator(&local_10e1);
      std::__cxx11::string::~string((string *)local_1040);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1000);
    }
    if (firstForConfig) {
      cmAlphaNum::cmAlphaNum(&local_1160,(string *)local_180);
      cmAlphaNum::cmAlphaNum(&local_1190,".ddi");
      cmStrCat<>((string *)local_1130,&local_1160,&local_1190);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
               ::operator[](&this->Configs,config);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&pmVar8->DDIFiles,(key_type *)((long)&sourceFilePath.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_01,(value_type *)local_1130);
      std::__cxx11::string::~string((string *)local_1130);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11b0,"JOB_POOL_COMPILE",
               (allocator<char> *)(dyndep.field_2._M_local_buf + 0xf));
    pcVar10 = GetGeneratorTarget(this);
    addPoolNinjaVariable
              (this,&local_11b0,pcVar10,
               (cmNinjaVars *)
               &ppBuild.OrderOnlyDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_11b0);
    std::allocator<char>::~allocator((allocator<char> *)(dyndep.field_2._M_local_buf + 0xf));
    pcVar4 = GetGlobalGenerator(this);
    pcVar11 = GetImplFileStream(this,fileConfig);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar4,(ostream *)pcVar11,(cmNinjaBuild *)&postFlag,objBuild.RspFile.field_2._8_4_,
               (bool *)0x0);
    GetDyndepFilePath((string *)local_11d8,this,(string *)((long)&sourceFilePath.field_2 + 8),config
                     );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&objBuild.ImplicitDeps.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_11d8);
    ppbVar2 = local_418;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11f8,"dyndep",
               (allocator<char> *)(ddModmapFile.field_2._M_local_buf + 0xf));
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)ppbVar2,&local_11f8);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)local_11d8);
    std::__cxx11::string::~string((string *)&local_11f8);
    std::allocator<char>::~allocator((allocator<char> *)(ddModmapFile.field_2._M_local_buf + 0xf));
    uVar12 = std::__cxx11::string::empty();
    if ((uVar12 & 1) == 0) {
      cmAlphaNum::cmAlphaNum(&local_1250,(string *)local_180);
      cmAlphaNum::cmAlphaNum(&local_1280,".modmap");
      cmStrCat<>((string *)local_1220,&local_1250,&local_1280);
      ppbVar2 = local_418;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_12a0,"DYNDEP_MODULE_MAP_FILE",&local_12a1);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)ppbVar2,&local_12a0);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)local_1220);
      std::__cxx11::string::~string((string *)&local_12a0);
      std::allocator<char>::~allocator(&local_12a1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&objBuild.ImplicitDeps.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_1220);
      std::__cxx11::string::~string((string *)local_1220);
    }
    std::__cxx11::string::~string((string *)local_11d8);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&postFlag);
    std::__cxx11::string::~string((string *)local_d38);
    std::__cxx11::string::~string((string *)(ppFileName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_c78);
  }
  EnsureParentDirectoryExists(this,(string *)local_180);
  pcVar13 = GetLocalGenerator(this);
  local_12d8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a0);
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_12c8,
             &(pcVar13->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter
             ,local_12d8,SHELL);
  ppbVar2 = local_418;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12f8,"OBJECT_DIR",&local_12f9)
  ;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)ppbVar2,&local_12f8);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_12c8);
  std::__cxx11::string::~string((string *)&local_12f8);
  std::allocator<char>::~allocator(&local_12f9);
  std::__cxx11::string::~string((string *)&local_12c8);
  pcVar13 = GetLocalGenerator(this);
  local_1330 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)(cmakeVarLang.field_2._M_local_buf + 8));
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_1320,
             &(pcVar13->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter
             ,local_1330,SHELL);
  ppbVar2 = local_418;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1350,"OBJECT_FILE_DIR",&local_1351);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)ppbVar2,&local_1350);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_1320);
  std::__cxx11::string::~string((string *)&local_1350);
  std::allocator<char>::~allocator(&local_1351);
  std::__cxx11::string::~string((string *)&local_1320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1378,"JOB_POOL_COMPILE",&local_1379);
  pcVar10 = GetGeneratorTarget(this);
  addPoolNinjaVariable(this,&local_1378,pcVar10,(cmNinjaVars *)local_418);
  std::__cxx11::string::~string((string *)&local_1378);
  std::allocator<char>::~allocator(&local_1379);
  bVar3 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1);
  pchIt.
  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  ._M_cur._6_1_ = 0;
  pchIt.
  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  ._M_cur._5_1_ = 0;
  local_1de9 = 0;
  if (!bVar3) {
    std::allocator<char>::allocator();
    pchIt.
    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
    ._M_cur._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_13a8,"SKIP_PRECOMPILE_HEADERS",
               (allocator<char> *)
               ((long)&pchIt.
                       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ._M_cur + 7));
    pchIt.
    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
    ._M_cur._5_1_ = 1;
    local_1388 = cmSourceFile::GetProperty(source,&local_13a8);
    bVar3 = cmValue::operator_cast_to_bool(&local_1388);
    local_1de9 = bVar3 ^ 0xff;
  }
  if ((pchIt.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_13a8);
  }
  if ((pchIt.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&pchIt.
                       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ._M_cur + 7));
  }
  if ((local_1de9 & 1) != 0) {
    psVar5 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    local_13b8._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,psVar5);
    local_13c0._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1);
    bVar3 = std::__detail::operator!=(&local_13b8,&local_13c0);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13e0,"JOB_POOL_PRECOMPILE_HEADER",&local_13e1);
      pcVar10 = GetGeneratorTarget(this);
      addPoolNinjaVariable(this,&local_13e0,pcVar10,(cmNinjaVars *)local_418);
      std::__cxx11::string::~string((string *)&local_13e0);
      std::allocator<char>::~allocator(&local_13e1);
    }
  }
  SetMsvcTargetPdbVariable(this,(cmNinjaVars *)local_418,config);
  cmAlphaNum::cmAlphaNum(&local_1438,(string *)local_180);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&objectName,".rsp");
  cmStrCat<>(&local_1408,&local_1438,(cmAlphaNum *)&objectName);
  std::__cxx11::string::operator=
            ((string *)&objBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)&local_1408);
  std::__cxx11::string::~string((string *)&local_1408);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&sourceFilePath.field_2 + 8),"ISPC");
  if (bVar3) {
    ispcSource.field_2._8_8_ =
         cmGeneratorTarget::GetObjectName_abi_cxx11_
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget,source);
    cmsys::SystemTools::GetFilenameWithoutLastExtension
              ((string *)local_1490,(string *)ispcSource.field_2._8_8_);
    cmsys::SystemTools::GetFilenameWithoutLastExtension
              ((string *)&ispcSuffixProp,(string *)local_1490);
    std::__cxx11::string::operator=((string *)local_1490,(string *)&ispcSuffixProp);
    std::__cxx11::string::~string((string *)&ispcSuffixProp);
    pcVar10 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_14d8,"ISPC_HEADER_SUFFIX",
               (allocator<char> *)(ispcHeaderDirectory.field_2._M_local_buf + 0xf));
    local_14b8 = cmGeneratorTarget::GetProperty(pcVar10,&local_14d8);
    std::__cxx11::string::~string((string *)&local_14d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(ispcHeaderDirectory.field_2._M_local_buf + 0xf));
    bVar3 = cmValue::operator_cast_to_bool(&local_14b8);
    if (!bVar3) {
      __assert_fail("ispcSuffixProp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmNinjaTargetGenerator.cxx"
                    ,0x613,
                    "void cmNinjaTargetGenerator::WriteObjectBuildStatement(const cmSourceFile *, const std::string &, const std::string &, bool)"
                   );
    }
    cmGeneratorTarget::GetObjectDirectory
              ((string *)&prop,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
    pcVar10 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1528,"ISPC_HEADER_DIRECTORY",&local_1529);
    local_1508 = cmGeneratorTarget::GetProperty(pcVar10,&local_1528);
    std::__cxx11::string::~string((string *)&local_1528);
    std::allocator<char>::~allocator(&local_1529);
    bVar3 = cmValue::operator_cast_to_bool(&local_1508);
    if (bVar3) {
      psVar5 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                         ((cmLocalGenerator *)this->LocalGenerator);
      cmAlphaNum::cmAlphaNum(&local_1580,psVar5);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&ispcHeader.field_2 + 8),'/');
      psVar5 = cmValue::operator*[abi_cxx11_(&local_1508);
      cmStrCat<std::__cxx11::string>
                (&local_1550,&local_1580,(cmAlphaNum *)((long)&ispcHeader.field_2 + 8),psVar5);
      std::__cxx11::string::operator=((string *)&prop,(string *)&local_1550);
      std::__cxx11::string::~string((string *)&local_1550);
    }
    cmAlphaNum::cmAlphaNum(&local_1600,(string *)&prop);
    cmAlphaNum::cmAlphaNum(&local_1630,'/');
    psVar5 = cmValue::operator*[abi_cxx11_(&local_14b8);
    cmStrCat<std::__cxx11::string,std::__cxx11::string>
              ((string *)local_15d0,&local_1600,&local_1630,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1490,
               psVar5);
    psVar5 = ConvertToNinjaPath(this,(string *)local_15d0);
    std::__cxx11::string::operator=((string *)local_15d0,(string *)psVar5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&objBuild.Outputs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_15d0);
    pcVar4 = GetGlobalGenerator(this);
    std::__cxx11::string::string
              ((string *)
               &ispcSuffixes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_15d0);
    cmGlobalNinjaGenerator::AddAdditionalCleanFile
              (pcVar4,(string *)
                      &ispcSuffixes.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,config);
    std::__cxx11::string::~string
              ((string *)
               &ispcSuffixes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    detail::ComputeISPCObjectSuffixes_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&rootObjectDir.field_2 + 8),
               (detail *)(this->super_cmCommonTargetGenerator).GeneratorTarget,target);
    sVar14 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&rootObjectDir.field_2 + 8));
    if (1 < sVar14) {
      cmGeneratorTarget::GetObjectDirectory
                ((string *)
                 &ispcSideEfffectObjects.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (this->super_cmCommonTargetGenerator).GeneratorTarget,config);
      detail::ComputeISPCExtraObjects
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range3,(string *)ispcSource.field_2._8_8_,
                 (string *)
                 &ispcSideEfffectObjects.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&rootObjectDir.field_2 + 8));
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range3);
      sideEffect.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range3);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&sideEffect.field_2 + 8));
        if (!bVar3) break;
        pbVar15 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end3);
        std::__cxx11::string::string((string *)local_16d8,(string *)pbVar15);
        psVar5 = ConvertToNinjaPath(this,(string *)local_16d8);
        std::__cxx11::string::operator=((string *)local_16d8,(string *)psVar5);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &objBuild.Outputs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16d8);
        pcVar4 = GetGlobalGenerator(this);
        std::__cxx11::string::string((string *)&local_16f8,(string *)local_16d8);
        cmGlobalNinjaGenerator::AddAdditionalCleanFile(pcVar4,&local_16f8,config);
        std::__cxx11::string::~string((string *)&local_16f8);
        std::__cxx11::string::~string((string *)local_16d8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range3);
      std::__cxx11::string::~string
                ((string *)
                 &ispcSideEfffectObjects.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    pcVar13 = GetLocalGenerator(this);
    local_1728 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_15d0);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_1718,
               &(pcVar13->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,local_1728,SHELL);
    ppbVar2 = local_418;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1748,"ISPC_HEADER_FILE",
               (allocator<char> *)
               ((long)&headers.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)ppbVar2,&local_1748);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_1718);
    std::__cxx11::string::~string((string *)&local_1748);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&headers.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_1718);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&rootObjectDir.field_2 + 8));
    std::__cxx11::string::~string((string *)local_15d0);
    std::__cxx11::string::~string((string *)&prop);
    std::__cxx11::string::~string((string *)local_1490);
  }
  else {
    cmGeneratorTarget::GetGeneratedISPCHeaders
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1768,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
    bVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1768);
    if (!bVar3) {
      local_1770._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1768);
      local_1778._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1768);
      local_1780._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1768);
      local_1788 = (cmGlobalNinjaGenerator *)MapToNinjaPath(this);
      local_1790 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                             (local_1770,local_1778,local_1780,(MapToNinjaPathImpl)local_1788);
      ppbVar2 = &objBuild.ImplicitDeps.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_17a0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ppbVar2);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_1798,&local_17a0);
      iVar16 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1768);
      iVar17 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1768);
      objectOutputs.Value =
           (string *)
           std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
           insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                     ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)ppbVar2,
                      local_1798,
                      (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )iVar16._M_current,
                      (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )iVar17._M_current);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1768);
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&sourceFilePath.field_2 + 8),"Swift");
  if (bVar3) {
    EmitSwiftDependencyInfo(this,source,config);
  }
  else {
    pcVar4 = GetGlobalGenerator(this);
    pcVar11 = GetImplFileStream(this,fileConfig);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar4,(ostream *)pcVar11,(cmNinjaBuild *)local_3f0,objBuild.RspFile.field_2._8_4_,
               (bool *)0x0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_17e0,"OBJECT_OUTPUTS",
             (allocator<char> *)(evaluatedObjectOutputs.field_2._M_local_buf + 0xf));
  local_17c0 = cmSourceFile::GetProperty(source,&local_17e0);
  std::__cxx11::string::~string((string *)&local_17e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(evaluatedObjectOutputs.field_2._M_local_buf + 0xf));
  bVar3 = cmValue::operator_cast_to_bool(&local_17c0);
  if (bVar3) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_17c0);
    std::__cxx11::string::string((string *)&local_1828,(string *)psVar5);
    pcVar13 = this->LocalGenerator;
    psVar5 = (string *)(build.RspFile.field_2._M_local_buf + 8);
    std::__cxx11::string::string((string *)psVar5);
    cmGeneratorExpression::Evaluate
              ((string *)local_1808,&local_1828,(cmLocalGenerator *)pcVar13,config,
               (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
               (cmGeneratorTarget *)0x0,psVar5);
    std::__cxx11::string::~string((string *)(build.RspFile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_1828);
    uVar12 = std::__cxx11::string::empty();
    if ((uVar12 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1988,"phony",&local_1989);
      cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_1968,&local_1988);
      std::__cxx11::string::~string((string *)&local_1988);
      std::allocator<char>::~allocator(&local_1989);
      std::__cxx11::string::operator=((string *)local_1968,"Additional output files.");
      sVar19 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1808);
      cmExpandedList_abi_cxx11_(&local_19a8,sVar19,false);
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(&build.Rule.field_2._M_allocated_capacity + 1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(this_00,&local_19a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_19a8);
      iVar16 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_00);
      iVar17 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(this_00);
      __result_00 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin(this_00);
      __unary_op = MapToNinjaPath(this);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )iVar16._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )iVar17._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__result_00._M_current,__unary_op);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&build.WorkDirOuts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&objBuild.Rule.field_2 + 8));
      pcVar4 = GetGlobalGenerator(this);
      pcVar11 = GetImplFileStream(this,fileConfig);
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar4,(ostream *)pcVar11,(cmNinjaBuild *)local_1968,0,(bool *)0x0);
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_1968);
    }
    std::__cxx11::string::~string((string *)local_1808);
  }
  std::__cxx11::string::~string((string *)(modmapFormatVar.field_2._M_local_buf + 8));
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&pchSources._M_h._M_single_bucket);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&architectures.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_3f0);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string((string *)(cmakeVarLang.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_180);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(sourceFilePath.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteObjectBuildStatement(
  cmSourceFile const* source, const std::string& config,
  const std::string& fileConfig, bool firstForConfig)
{
  std::string const language = source->GetLanguage();
  std::string const sourceFilePath = this->GetCompiledSourceNinjaPath(source);
  std::string const objectDir = this->ConvertToNinjaPath(
    cmStrCat(this->GeneratorTarget->GetSupportDirectory(),
             this->GetGlobalGenerator()->ConfigDirectory(config)));
  std::string const objectFileName =
    this->ConvertToNinjaPath(this->GetObjectFilePath(source, config));
  std::string const objectFileDir =
    cmSystemTools::GetFilenamePath(objectFileName);

  std::string cmakeVarLang = cmStrCat("CMAKE_", language);

  // build response file name
  std::string cmakeLinkVar = cmStrCat(cmakeVarLang, "_RESPONSE_FILE_FLAG");

  cmValue flag = this->GetMakefile()->GetDefinition(cmakeLinkVar);

  bool const lang_supports_response =
    !(language == "RC" || (language == "CUDA" && !flag));
  int const commandLineLengthLimit =
    ((lang_supports_response && this->ForceResponseFile())) ? -1 : 0;

  cmNinjaBuild objBuild(this->LanguageCompilerRule(language, config));
  cmNinjaVars& vars = objBuild.Variables;
  vars["FLAGS"] = this->ComputeFlagsForObject(source, language, config);
  vars["DEFINES"] = this->ComputeDefines(source, language, config);
  vars["INCLUDES"] = this->ComputeIncludes(source, language, config);

  if (this->GetMakefile()->GetSafeDefinition(
        cmStrCat("CMAKE_", language, "_DEPFILE_FORMAT")) != "msvc"_s) {
    bool replaceExt(false);
    if (!language.empty()) {
      std::string repVar =
        cmStrCat("CMAKE_", language, "_DEPFILE_EXTENSION_REPLACE");
      replaceExt = this->Makefile->IsOn(repVar);
    }
    if (!replaceExt) {
      // use original code
      vars["DEP_FILE"] = this->GetLocalGenerator()->ConvertToOutputFormat(
        cmStrCat(objectFileName, ".d"), cmOutputConverter::SHELL);
    } else {
      // Replace the original source file extension with the
      // depend file extension.
      std::string dependFileName = cmStrCat(
        cmSystemTools::GetFilenameWithoutLastExtension(objectFileName), ".d");
      vars["DEP_FILE"] = this->GetLocalGenerator()->ConvertToOutputFormat(
        cmStrCat(objectFileDir, '/', dependFileName),
        cmOutputConverter::SHELL);
    }
  }

  if (firstForConfig) {
    this->ExportObjectCompileCommand(
      language, sourceFilePath, objectDir, objectFileName, objectFileDir,
      vars["FLAGS"], vars["DEFINES"], vars["INCLUDES"], config);
  }

  objBuild.Outputs.push_back(objectFileName);
  if (firstForConfig) {
    cmValue pchExtension =
      this->GetMakefile()->GetDefinition("CMAKE_PCH_EXTENSION");
    if (!cmHasSuffix(objectFileName, pchExtension)) {
      // Add this object to the list of object files.
      this->Configs[config].Objects.push_back(objectFileName);
    }
  }

  objBuild.ExplicitDeps.push_back(sourceFilePath);

  // Add precompile headers dependencies
  std::vector<std::string> depList;

  std::vector<std::string> architectures;
  this->GeneratorTarget->GetAppleArchs(config, architectures);
  if (architectures.empty()) {
    architectures.emplace_back();
  }

  std::unordered_set<std::string> pchSources;
  for (const std::string& arch : architectures) {
    const std::string pchSource =
      this->GeneratorTarget->GetPchSource(config, language, arch);

    if (!pchSource.empty()) {
      pchSources.insert(pchSource);
    }
  }

  if (!pchSources.empty() && !source->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
    for (const std::string& arch : architectures) {
      depList.push_back(
        this->GeneratorTarget->GetPchHeader(config, language, arch));
      if (pchSources.find(source->GetFullPath()) == pchSources.end()) {
        depList.push_back(
          this->GeneratorTarget->GetPchFile(config, language, arch));
      }
    }
  }

  if (cmValue objectDeps = source->GetProperty("OBJECT_DEPENDS")) {
    std::vector<std::string> objDepList = cmExpandedList(*objectDeps);
    std::copy(objDepList.begin(), objDepList.end(),
              std::back_inserter(depList));
  }

  if (!depList.empty()) {
    for (std::string& odi : depList) {
      if (cmSystemTools::FileIsFullPath(odi)) {
        odi = cmSystemTools::CollapseFullPath(odi);
      }
    }
    std::transform(depList.begin(), depList.end(),
                   std::back_inserter(objBuild.ImplicitDeps),
                   this->MapToNinjaPath());
  }

  objBuild.OrderOnlyDeps.push_back(this->OrderDependsTargetForTarget(config));

  // If the source file is GENERATED and does not have a custom command
  // (either attached to this source file or another one), assume that one of
  // the target dependencies, OBJECT_DEPENDS or header file custom commands
  // will rebuild the file.
  if (source->GetIsGenerated() &&
      !source->GetPropertyAsBool("__CMAKE_GENERATED_BY_CMAKE") &&
      !source->GetCustomCommand() &&
      !this->GetGlobalGenerator()->HasCustomCommandOutput(sourceFilePath)) {
    this->GetGlobalGenerator()->AddAssumedSourceDependencies(
      sourceFilePath, objBuild.OrderOnlyDeps);
  }

  // For some cases we scan to dynamically discover dependencies.
  bool const needDyndep = this->NeedDyndep(language, config);
  bool const compilationPreprocesses =
    !this->NeedExplicitPreprocessing(language);

  std::string modmapFormat;
  if (needDyndep) {
    std::string const modmapFormatVar =
      cmStrCat("CMAKE_EXPERIMENTAL_", language, "_MODULE_MAP_FORMAT");
    modmapFormat = this->Makefile->GetSafeDefinition(modmapFormatVar);
  }

  if (needDyndep) {
    // If source/target has preprocessing turned off, we still need to
    // generate an explicit dependency step
    const auto srcpp = source->GetSafeProperty("Fortran_PREPROCESS");
    cmOutputConverter::FortranPreprocess preprocess =
      cmOutputConverter::GetFortranPreprocess(srcpp);
    if (preprocess == cmOutputConverter::FortranPreprocess::Unset) {
      const auto& tgtpp =
        this->GeneratorTarget->GetSafeProperty("Fortran_PREPROCESS");
      preprocess = cmOutputConverter::GetFortranPreprocess(tgtpp);
    }

    bool const compilePP = !compilationPreprocesses &&
      (preprocess != cmOutputConverter::FortranPreprocess::NotNeeded);
    bool const compilePPWithDefines =
      compilePP && this->CompileWithDefines(language);

    std::string scanRuleName;
    std::string ppFileName;
    if (compilePP) {
      scanRuleName = this->LanguagePreprocessAndScanRule(language, config);
      ppFileName = this->ConvertToNinjaPath(
        this->GetPreprocessedFilePath(source, config));
    } else {
      scanRuleName = this->LanguageScanRule(language, config);
      ppFileName = cmStrCat(objectFileName, ".ddi.i");
    }

    cmNinjaBuild ppBuild = GetScanBuildStatement(
      scanRuleName, ppFileName, compilePP, compilePPWithDefines, objBuild,
      vars, modmapFormat, objectFileName, this->LocalGenerator);

    if (compilePP) {
      // In case compilation requires flags that are incompatible with
      // preprocessing, include them here.
      std::string const& postFlag = this->Makefile->GetSafeDefinition(
        cmStrCat("CMAKE_", language, "_POSTPROCESS_FLAG"));
      this->LocalGenerator->AppendFlags(vars["FLAGS"], postFlag);

      // Prepend source file's original directory as an include directory
      // so e.g. Fortran INCLUDE statements can look for files in it.
      std::vector<std::string> sourceDirectory;
      sourceDirectory.push_back(
        cmSystemTools::GetParentDirectory(source->GetFullPath()));

      std::string sourceDirectoryFlag = this->LocalGenerator->GetIncludeFlags(
        sourceDirectory, this->GeneratorTarget, language, config, false);

      vars["INCLUDES"] = cmStrCat(sourceDirectoryFlag, ' ', vars["INCLUDES"]);
    }

    if (firstForConfig) {
      std::string const ddiFile = cmStrCat(objectFileName, ".ddi");
      this->Configs[config].DDIFiles[language].push_back(ddiFile);
    }

    this->addPoolNinjaVariable("JOB_POOL_COMPILE", this->GetGeneratorTarget(),
                               ppBuild.Variables);

    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           ppBuild, commandLineLengthLimit);

    std::string const dyndep = this->GetDyndepFilePath(language, config);
    objBuild.OrderOnlyDeps.push_back(dyndep);
    vars["dyndep"] = dyndep;

    if (!modmapFormat.empty()) {
      std::string const ddModmapFile = cmStrCat(objectFileName, ".modmap");
      vars["DYNDEP_MODULE_MAP_FILE"] = ddModmapFile;
      objBuild.OrderOnlyDeps.push_back(ddModmapFile);
    }
  }

  this->EnsureParentDirectoryExists(objectFileName);

  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    objectDir, cmOutputConverter::SHELL);
  vars["OBJECT_FILE_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    objectFileDir, cmOutputConverter::SHELL);

  this->addPoolNinjaVariable("JOB_POOL_COMPILE", this->GetGeneratorTarget(),
                             vars);

  if (!pchSources.empty() && !source->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
    auto pchIt = pchSources.find(source->GetFullPath());
    if (pchIt != pchSources.end()) {
      this->addPoolNinjaVariable("JOB_POOL_PRECOMPILE_HEADER",
                                 this->GetGeneratorTarget(), vars);
    }
  }

  this->SetMsvcTargetPdbVariable(vars, config);

  objBuild.RspFile = cmStrCat(objectFileName, ".rsp");

  if (language == "ISPC") {
    std::string const& objectName =
      this->GeneratorTarget->GetObjectName(source);
    std::string ispcSource =
      cmSystemTools::GetFilenameWithoutLastExtension(objectName);
    ispcSource = cmSystemTools::GetFilenameWithoutLastExtension(ispcSource);

    cmValue ispcSuffixProp =
      this->GeneratorTarget->GetProperty("ISPC_HEADER_SUFFIX");
    assert(ispcSuffixProp);

    std::string ispcHeaderDirectory =
      this->GeneratorTarget->GetObjectDirectory(config);
    if (cmValue prop =
          this->GeneratorTarget->GetProperty("ISPC_HEADER_DIRECTORY")) {
      ispcHeaderDirectory =
        cmStrCat(this->LocalGenerator->GetBinaryDirectory(), '/', *prop);
    }

    std::string ispcHeader =
      cmStrCat(ispcHeaderDirectory, '/', ispcSource, *ispcSuffixProp);
    ispcHeader = this->ConvertToNinjaPath(ispcHeader);

    // Make sure ninja knows what command generates the header
    objBuild.ImplicitOuts.push_back(ispcHeader);

    // Make sure ninja knows how to clean the generated header
    this->GetGlobalGenerator()->AddAdditionalCleanFile(ispcHeader, config);

    auto ispcSuffixes =
      detail::ComputeISPCObjectSuffixes(this->GeneratorTarget);
    if (ispcSuffixes.size() > 1) {
      std::string rootObjectDir =
        this->GeneratorTarget->GetObjectDirectory(config);
      auto ispcSideEfffectObjects = detail::ComputeISPCExtraObjects(
        objectName, rootObjectDir, ispcSuffixes);

      for (auto sideEffect : ispcSideEfffectObjects) {
        sideEffect = this->ConvertToNinjaPath(sideEffect);
        objBuild.ImplicitOuts.emplace_back(sideEffect);
        this->GetGlobalGenerator()->AddAdditionalCleanFile(sideEffect, config);
      }
    }

    vars["ISPC_HEADER_FILE"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        ispcHeader, cmOutputConverter::SHELL);
  } else {
    auto headers = this->GeneratorTarget->GetGeneratedISPCHeaders(config);
    if (!headers.empty()) {
      std::transform(headers.begin(), headers.end(), headers.begin(),
                     this->MapToNinjaPath());
      objBuild.OrderOnlyDeps.insert(objBuild.OrderOnlyDeps.end(),
                                    headers.begin(), headers.end());
    }
  }

  if (language == "Swift") {
    this->EmitSwiftDependencyInfo(source, config);
  } else {
    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           objBuild, commandLineLengthLimit);
  }

  if (cmValue objectOutputs = source->GetProperty("OBJECT_OUTPUTS")) {
    std::string evaluatedObjectOutputs = cmGeneratorExpression::Evaluate(
      *objectOutputs, this->LocalGenerator, config);

    if (!evaluatedObjectOutputs.empty()) {
      cmNinjaBuild build("phony");
      build.Comment = "Additional output files.";
      build.Outputs = cmExpandedList(evaluatedObjectOutputs);
      std::transform(build.Outputs.begin(), build.Outputs.end(),
                     build.Outputs.begin(), this->MapToNinjaPath());
      build.ExplicitDeps = objBuild.Outputs;
      this->GetGlobalGenerator()->WriteBuild(
        this->GetImplFileStream(fileConfig), build);
    }
  }
}